

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.h
# Opt level: O0

Rgba * Imf_3_4::ComputeBasePointer(Rgba *ptr,V2i *origin,int64_t w,size_t xStride,size_t yStride)

{
  int64_t offy;
  int64_t offx;
  size_t yStride_local;
  size_t xStride_local;
  int64_t w_local;
  V2i *origin_local;
  Rgba *ptr_local;
  
  yStride_local = yStride;
  if (yStride == 0) {
    yStride_local = w;
  }
  return ptr + (-(xStride * (long)origin->x) - yStride_local * (long)origin->y);
}

Assistant:

inline Rgba*
ComputeBasePointer (
    Rgba*                       ptr,
    const IMATH_NAMESPACE::V2i& origin,
    int64_t                     w,
    size_t                      xStride = 1,
    size_t                      yStride = 0)
{
    if (yStride == 0) yStride = w;
    int64_t offx = static_cast<int64_t> (origin.x);
    offx *= xStride;
    int64_t offy = static_cast<int64_t> (origin.y);
    offy *= yStride;
    return ptr - offx - offy;
}